

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  int *piVar1;
  u8 uVar2;
  ExprList_item *pEVar3;
  Table *pTVar4;
  ushort uVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar6;
  Column *data;
  ExprList_item *pEVar7;
  Expr *pEVar8;
  byte *pKey;
  HashElem *pHVar9;
  size_t sVar10;
  ulong uVar11;
  Column *pCVar12;
  byte bVar13;
  char *pcVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  u32 cnt;
  uint h;
  Hash ht;
  uint local_84;
  Column *local_80;
  Column **local_78;
  i16 *local_70;
  char *local_68;
  long local_60;
  ExprList *local_58;
  uint local_4c;
  Hash local_48;
  
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  if (pEList == (ExprList *)0x0) {
    *pnCol = 0;
    *paCol = (Column *)0x0;
    uVar16 = 0;
    data = (Column *)0x0;
    pcVar14 = (char *)((long)&pParse->nLabel + 1);
  }
  else {
    iVar6 = pEList->nExpr;
    lVar17 = (long)iVar6;
    data = (Column *)sqlite3DbMallocZero((sqlite3 *)pParse,lVar17 << 5);
    pcVar14 = (char *)((long)&pParse->nLabel + 1);
    *pnCol = (i16)iVar6;
    *paCol = data;
    if (lVar17 < 1) {
      uVar16 = 0;
    }
    else {
      lVar18 = 0;
      local_80 = data;
      local_78 = paCol;
      local_70 = pnCol;
      local_68 = pcVar14;
      local_60 = lVar17;
      local_58 = pEList;
      do {
        if (*local_68 != '\0') {
          uVar16 = (uint)lVar18;
          data = local_80;
          pnCol = local_70;
          paCol = local_78;
          pcVar14 = local_68;
          goto LAB_0015c713;
        }
        pEVar3 = local_58->a;
        pEVar8 = pEVar3[lVar18].pExpr;
        while (pEVar8 != (Expr *)0x0) {
          if ((pEVar8->flags >> 0xc & 1) == 0) goto LAB_0015c530;
          if ((pEVar8->flags >> 0x12 & 1) == 0) {
            pEVar7 = (ExprList_item *)&pEVar8->pLeft;
          }
          else {
            pEVar7 = ((pEVar8->x).pList)->a;
          }
          pEVar8 = pEVar7->pExpr;
        }
        pEVar8 = (Expr *)0x0;
LAB_0015c530:
        pcVar14 = pEVar3[lVar18].zName;
        if (pcVar14 == (char *)0x0) {
          for (; uVar2 = pEVar8->op, uVar2 == 'z'; pEVar8 = pEVar8->pRight) {
          }
          if (uVar2 == '7') {
            pCVar12 = (Column *)&pEVar8->u;
          }
          else if ((uVar2 == 0x98) && (pTVar4 = pEVar8->pTab, pTVar4 != (Table *)0x0)) {
            uVar5 = pEVar8->iColumn;
            if ((short)uVar5 < 0) {
              uVar5 = pTVar4->iPKey;
              pcVar14 = "rowid";
              if ((short)uVar5 < 0) goto LAB_0015c594;
            }
            pCVar12 = pTVar4->aCol + uVar5;
          }
          else {
            pCVar12 = (Column *)&pEVar3[lVar18].zSpan;
          }
          pcVar14 = pCVar12->zName;
        }
LAB_0015c594:
        pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"%s",pcVar14);
        local_84 = 0;
        while (pKey != (byte *)0x0) {
          pHVar9 = findElementWithHash(&local_48,(char *)pKey,&local_4c);
          if ((pHVar9 == (HashElem *)0x0) || (pHVar9->data == (void *)0x0)) {
            data->zName = (char *)pKey;
            pCVar12 = (Column *)sqlite3HashInsert(&local_48,(char *)pKey,data);
            if ((pCVar12 == data) &&
               ((*local_68 == '\0' && (*(char *)((long)&pParse->nLabel + 2) == '\0')))) {
              *(undefined1 *)((long)&pParse->nLabel + 1) = 1;
              if (0 < (int)pParse->oldmask) {
                pParse->aColCache[7].iTable = 1;
              }
              piVar1 = &pParse->aColCache[7].iLevel;
              *piVar1 = *piVar1 + 1;
            }
            goto LAB_0015c6ba;
          }
          sVar10 = strlen((char *)pKey);
          if ((sVar10 & 0x3fffffff) == 0) {
            uVar15 = 0;
          }
          else {
            uVar11 = (ulong)((uint)sVar10 & 0x3fffffff);
            do {
              if (uVar11 < 2) {
                bVar13 = *pKey;
                uVar11 = 0;
                break;
              }
              uVar11 = uVar11 - 1;
              bVar13 = pKey[uVar11 & 0xffffffff];
            } while (0xfffffffffffffff5 < (ulong)bVar13 - 0x3a);
            uVar15 = (ulong)((uint)sVar10 & 0x3fffffff);
            if (bVar13 == 0x3a) {
              uVar15 = uVar11 & 0xffffffff;
            }
          }
          local_84 = local_84 + 1;
          pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"%.*z:%u",uVar15,pKey);
          if (3 < local_84) {
            sqlite3_randomness(4,&local_84);
          }
        }
        data->zName = (char *)0x0;
LAB_0015c6ba:
        lVar18 = lVar18 + 1;
        data = data + 1;
      } while (lVar18 != local_60);
      uVar16 = (uint)local_60;
      data = local_80;
      pnCol = local_70;
      paCol = local_78;
      pcVar14 = local_68;
    }
  }
LAB_0015c713:
  sqlite3HashClear(&local_48);
  iVar6 = extraout_EAX;
  if (*pcVar14 != '\0') {
    if (uVar16 != 0) {
      lVar17 = 0;
      do {
        sqlite3DbFree((sqlite3 *)pParse,*(void **)((long)&data->zName + lVar17));
        lVar17 = lVar17 + 0x20;
      } while ((ulong)uVar16 << 5 != lVar17);
    }
    sqlite3DbFree((sqlite3 *)pParse,data);
    *paCol = (Column *)0x0;
    *pnCol = 0;
    iVar6 = extraout_EAX_00;
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  Expr *p;                    /* Expression for a single result column */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    p = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = p;  /* The expression that is the result column name */
      Table *pTab;         /* Table associated with this expression */
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && ALWAYS(pColExpr->pTab!=0) ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    zName = sqlite3MPrintf(db, "%s", zName);

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}